

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O3

void __thiscall
duckdb::LocalSortState::Initialize
          (LocalSortState *this,GlobalSortState *global_sort_state,BufferManager *buffer_manager_p)

{
  BufferManager *pBVar1;
  idx_t iVar2;
  int iVar3;
  undefined4 extraout_var;
  RowDataCollection *pRVar4;
  idx_t block_capacity;
  
  this->sort_layout = &global_sort_state->sort_layout;
  this->payload_layout = &global_sort_state->payload_layout;
  this->buffer_manager = buffer_manager_p;
  iVar3 = (*buffer_manager_p->_vptr_BufferManager[0xf])(buffer_manager_p);
  block_capacity = CONCAT44(extraout_var,iVar3);
  pBVar1 = this->buffer_manager;
  iVar2 = this->sort_layout->entry_size;
  pRVar4 = (RowDataCollection *)operator_new(0x80);
  RowDataCollection::RowDataCollection(pRVar4,pBVar1,block_capacity / iVar2,iVar2,false);
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->radix_sorting_data,pRVar4);
  if (this->sort_layout->all_constant == false) {
    iVar2 = (this->sort_layout->blob_layout).row_width;
    pBVar1 = this->buffer_manager;
    pRVar4 = (RowDataCollection *)operator_new(0x80);
    RowDataCollection::RowDataCollection(pRVar4,pBVar1,block_capacity / iVar2,iVar2,false);
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->blob_sorting_data,pRVar4);
    pBVar1 = this->buffer_manager;
    pRVar4 = (RowDataCollection *)operator_new(0x80);
    RowDataCollection::RowDataCollection(pRVar4,pBVar1,block_capacity,1,true);
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->blob_sorting_heap,pRVar4);
  }
  pBVar1 = this->buffer_manager;
  iVar2 = this->payload_layout->row_width;
  pRVar4 = (RowDataCollection *)operator_new(0x80);
  RowDataCollection::RowDataCollection(pRVar4,pBVar1,block_capacity / iVar2,iVar2,false);
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->payload_data,pRVar4);
  pBVar1 = this->buffer_manager;
  pRVar4 = (RowDataCollection *)operator_new(0x80);
  RowDataCollection::RowDataCollection(pRVar4,pBVar1,block_capacity,1,true);
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->payload_heap,pRVar4);
  this->initialized = true;
  return;
}

Assistant:

void LocalSortState::Initialize(GlobalSortState &global_sort_state, BufferManager &buffer_manager_p) {
	sort_layout = &global_sort_state.sort_layout;
	payload_layout = &global_sort_state.payload_layout;
	buffer_manager = &buffer_manager_p;
	const auto block_size = buffer_manager->GetBlockSize();

	// Radix sorting data
	auto entries_per_block = RowDataCollection::EntriesPerBlock(sort_layout->entry_size, block_size);
	radix_sorting_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, sort_layout->entry_size);

	// Blob sorting data
	if (!sort_layout->all_constant) {
		auto blob_row_width = sort_layout->blob_layout.GetRowWidth();
		entries_per_block = RowDataCollection::EntriesPerBlock(blob_row_width, block_size);
		blob_sorting_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, blob_row_width);
		blob_sorting_heap = make_uniq<RowDataCollection>(*buffer_manager, block_size, 1U, true);
	}

	// Payload data
	auto payload_row_width = payload_layout->GetRowWidth();
	entries_per_block = RowDataCollection::EntriesPerBlock(payload_row_width, block_size);
	payload_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, payload_row_width);
	payload_heap = make_uniq<RowDataCollection>(*buffer_manager, block_size, 1U, true);
	initialized = true;
}